

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreRecursive.cpp
# Opt level: O0

void mathCore::to_DNF(expression *a)

{
  bool bVar1;
  ostream *poVar2;
  reference ppeVar3;
  _Self local_130;
  _Base_ptr local_128;
  _Base_ptr local_120;
  expression *local_118;
  expression *big_term;
  undefined4 local_104;
  _Base_ptr local_100;
  _Base_ptr local_f8;
  _Base_ptr local_f0;
  _Self local_e8;
  _Self local_e0;
  iterator iter_1;
  expression *child_1;
  expSet tempSet_1;
  _Self local_88;
  _Self local_80;
  iterator iter;
  expression *child;
  expSet tempSet;
  mathCore local_30 [32];
  expression *local_10;
  expression *a_local;
  
  local_10 = a;
  poVar2 = std::operator<<((ostream *)&std::cout,"DNF CALLED WITH ");
  as_string_abi_cxx11_(local_30,local_10);
  poVar2 = std::operator<<(poVar2,(string *)local_30);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)local_30);
  bVar1 = is_DNF(local_10);
  if (bVar1) {
    recursive_idempotent(local_10);
  }
  else {
    bVar1 = is_or(local_10);
    if (((!bVar1) || (bVar1 = is_dualed(local_10), bVar1)) || (bVar1 = is_negated(local_10), bVar1))
    {
      bVar1 = is_and(local_10);
      if (((bVar1) && (bVar1 = is_dualed(local_10), !bVar1)) &&
         (bVar1 = is_negated(local_10), !bVar1)) {
        std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::multiset
                  ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)&child_1);
        local_e0._M_node =
             (_Base_ptr)
             std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::begin
                       (&local_10->contents);
        while( true ) {
          local_e8._M_node =
               (_Base_ptr)
               std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::end
                         (&local_10->contents);
          bVar1 = std::operator!=(&local_e0,&local_e8);
          if (!bVar1) break;
          ppeVar3 = std::_Rb_tree_const_iterator<expression_*>::operator*(&local_e0);
          iter_1._M_node = (_Base_ptr)*ppeVar3;
          local_f8 = local_e0._M_node;
          local_f0 = (_Base_ptr)
                     std::multiset<expression*,compareUUID,std::allocator<expression*>>::
                     erase_abi_cxx11_((multiset<expression*,compareUUID,std::allocator<expression*>>
                                       *)&local_10->contents,local_e0._M_node);
          local_e0._M_node = local_f0;
          to_CNF((expression *)iter_1._M_node);
          local_100 = (_Base_ptr)
                      std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::
                      insert((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)
                             &child_1,(value_type *)&iter_1);
        }
        mergeMultiSet(&local_10->contents,(expSet *)&child_1);
        recursive_combine_and(local_10);
        idempotent_law(local_10);
        universal_bound(local_10);
        bVar1 = is_DNF(local_10);
        if (bVar1) {
          local_104 = 1;
        }
        else {
          big_term = (expression *)
                     std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::begin
                               (&local_10->contents);
          local_e0._M_node = (_Base_ptr)big_term;
          ppeVar3 = std::_Rb_tree_const_iterator<expression_*>::operator*(&local_e0);
          local_118 = *ppeVar3;
          local_128 = local_e0._M_node;
          local_120 = (_Base_ptr)
                      std::multiset<expression*,compareUUID,std::allocator<expression*>>::
                      erase_abi_cxx11_((multiset<expression*,compareUUID,std::allocator<expression*>>
                                        *)&local_10->contents,local_e0._M_node);
          local_e0._M_node = local_120;
          while( true ) {
            local_130._M_node =
                 (_Base_ptr)
                 std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::end
                           (&local_10->contents);
            bVar1 = std::operator!=(&local_e0,&local_130);
            if (!bVar1) break;
            ppeVar3 = std::_Rb_tree_const_iterator<expression_*>::operator*(&local_e0);
            iter_1._M_node = (_Base_ptr)*ppeVar3;
            local_e0._M_node =
                 (_Base_ptr)
                 std::multiset<expression*,compareUUID,std::allocator<expression*>>::
                 erase_abi_cxx11_((multiset<expression*,compareUUID,std::allocator<expression*>> *)
                                  &local_10->contents,local_e0._M_node);
            do_expansion(local_10,local_118,(expression *)iter_1._M_node);
          }
          std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::insert
                    (&local_10->contents,&local_118);
          empty_expression(local_10);
          local_104 = 0;
        }
        std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::~multiset
                  ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)&child_1);
      }
    }
    else {
      std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::multiset
                ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)&child);
      local_80._M_node =
           (_Base_ptr)
           std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::begin
                     (&local_10->contents);
      while( true ) {
        local_88._M_node =
             (_Base_ptr)
             std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::end
                       (&local_10->contents);
        bVar1 = std::operator!=(&local_80,&local_88);
        if (!bVar1) break;
        ppeVar3 = std::_Rb_tree_const_iterator<expression_*>::operator*(&local_80);
        iter._M_node = (_Base_ptr)*ppeVar3;
        local_80._M_node =
             (_Base_ptr)
             std::multiset<expression*,compareUUID,std::allocator<expression*>>::erase_abi_cxx11_
                       ((multiset<expression*,compareUUID,std::allocator<expression*>> *)
                        &local_10->contents,local_80._M_node);
        to_DNF((expression *)iter._M_node);
        tempSet_1._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::insert
                               ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>
                                 *)&child,(value_type *)&iter);
      }
      mergeMultiSet(&local_10->contents,(expSet *)&child);
      combine_or(local_10);
      idempotent_law(local_10);
      universal_bound(local_10);
      std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::~multiset
                ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)&child);
    }
  }
  return;
}

Assistant:

void mathCore::to_DNF(expression *a) {
	
	std::cout << "DNF CALLED WITH " << as_string(a) << "\n";

	if (mathCore::is_DNF(a)) { // If we are already a DNF just return!
		// Normally you need to be a minimized one, we don't bother doing that!
		recursive_idempotent(a);
		return;
	}
	else if (mathCore::is_or(a) && !(is_dualed(a) || is_negated(a))) {
		// If we are an OR statement then fancy things can happen

		expSet tempSet;
		expression* child;
		auto iter = a->contents.begin();
		while (iter != a->contents.end()) {
			child = *iter;
			iter = a->contents.erase(iter);

			to_DNF(child);
			tempSet.insert(child);
		}
		mergeMultiSet(a->contents, tempSet);
		// Our children now are DNFED!

		// Pull our children up together
		combine_or(a);
		// The only simplifcation we do is idempotent
		mathCore::idempotent_law(a);
		mathCore::universal_bound(a);

		/*
		Need Quine�McCluskey algorithm or Similar here
		Currently its dumb!
		*/
	}
	else if (mathCore::is_and(a) && !(is_dualed(a) || is_negated(a))) {
		// If we are an and statement
		expSet tempSet;
		expression* child;
		auto iter = a->contents.begin();
		while (iter != a->contents.end()) {
			child = *iter;
			iter = a->contents.erase(iter);

			to_CNF(child);
			tempSet.insert(child);
		}
		mergeMultiSet(a->contents, tempSet);
		// Our children now are CNFED!
		// First pull them all up into ourselves
		recursive_combine_and(a);
		mathCore::idempotent_law(a);
		mathCore::universal_bound(a);

		// If we became a valid DNF return
		if (is_DNF(a)) {
			return;
		}

		// We aren't a valid DNF, so something needs to be expanded
		// Iter is definitinitly a sum
		iter = a->contents.begin();
		expression* big_term = *iter;
		iter = a->contents.erase(iter);

		while (iter != a->contents.end()) {
			child = *iter;
			iter = a->contents.erase(iter);
			do_expansion(a, big_term, child);
		}

		// Put only big term back!
		a->contents.insert(big_term);
		empty_expression(a);	// Transmuting call!
	}
}